

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QString * offsetFromAbbreviation(QString *__return_storage_ptr__,QString *text)

{
  bool bVar1;
  long in_FS_OFFSET;
  QLatin1StringView s;
  QLatin1StringView s_00;
  QStringBuilder<QStringView_&,_QLatin1String> local_48;
  QStringView local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.m_data = (text->d).ptr;
  local_30.m_size = (text->d).size;
  s.m_data = "UTC";
  s.m_size = 3;
  bVar1 = QStringView::startsWith(&local_30,s,CaseSensitive);
  if ((bVar1) ||
     (s_00.m_data = "GMT", s_00.m_size = 3,
     bVar1 = QStringView::startsWith(&local_30,s_00,CaseSensitive), bVar1)) {
    local_30.m_size = local_30.m_size + -3;
    local_30.m_data = local_30.m_data + 3;
  }
  if (local_30.m_size == 0) {
    Qt::Literals::StringLiterals::operator____s(__return_storage_ptr__,L"+00:00",6);
  }
  else if (local_30.m_size < 4) {
    local_48.b.m_size = 3;
    local_48.b.m_data = ":00";
    local_48.a = &local_30;
    QStringBuilder<QStringView_&,_QLatin1String>::convertTo<QString>
              (__return_storage_ptr__,&local_48);
  }
  else {
    QString::right(__return_storage_ptr__,text,local_30.m_size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

static QString offsetFromAbbreviation(QString &&text)
{
    QStringView tail{text};
    // May need to strip a prefix:
    if (tail.startsWith("UTC"_L1) || tail.startsWith("GMT"_L1))
        tail = tail.sliced(3);
    // TODO: there may be a locale-specific alternative prefix.
    // Hard to know without zone-name L10n details, though.
    return (tail.isEmpty() // The Qt::UTC case omits the zero offset:
            ? u"+00:00"_s
            // Whole-hour offsets may lack the zero minutes:
            : (tail.size() <= 3
               ? tail + ":00"_L1
               : std::move(text).right(tail.size())));
}